

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_cipher_do_ctr(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  long lVar1;
  ulong uVar2;
  ulong in_RCX;
  byte *in_RDX;
  grasshopper_w128_t *in_RSI;
  undefined8 in_RDI;
  grasshopper_w128_t tmp;
  grasshopper_w128_t *iv_buffer;
  size_t blocks;
  size_t i;
  size_t lasted;
  uint n;
  grasshopper_w128_t *currentOutputBlock;
  grasshopper_w128_t *currentInputBlock;
  uchar *current_out;
  uchar *current_in;
  uchar *iv;
  gost_grasshopper_cipher_ctx_ctr *c;
  grasshopper_w128_t *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar3;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  ulong local_68;
  ulong local_60;
  uint local_54;
  grasshopper_w128_t *local_40;
  byte *local_38;
  
  lVar1 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  EVP_CIPHER_CTX_iv_noconst(in_RDI);
  local_54 = EVP_CIPHER_CTX_get_num(in_RDI);
  local_60 = in_RCX;
  local_40 = in_RSI;
  local_38 = in_RDX;
  for (; uVar3 = local_54 != 0 && local_60 != 0, local_54 != 0 && local_60 != 0;
      local_54 = local_54 + 1 & 0xf) {
    local_40->b[0] = *local_38 ^ *(byte *)(lVar1 + 0x198 + (ulong)local_54);
    local_60 = local_60 - 1;
    local_40 = (grasshopper_w128_t *)(local_40->b + 1);
    local_38 = local_38 + 1;
  }
  EVP_CIPHER_CTX_set_num(in_RDI,local_54);
  uVar2 = local_60 >> 4;
  for (local_68 = 0; local_68 < uVar2; local_68 = local_68 + 1) {
    grasshopper_encrypt_block
              ((grasshopper_round_keys_t *)in_stack_ffffffffffffff80,
               (grasshopper_w128_t *)in_stack_ffffffffffffff78,
               (grasshopper_w128_t *)CONCAT17(uVar3,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    grasshopper_plus128((grasshopper_w128_t *)CONCAT17(uVar3,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68,(grasshopper_w128_t *)0x1277e7);
    grasshopper_copy128(local_40,(grasshopper_w128_t *)&stack0xffffffffffffff78);
    ctr128_inc((uchar *)0x127800);
    local_38 = local_38 + 0x10;
    local_40 = local_40 + 1;
    local_60 = local_60 - 0x10;
  }
  if (local_60 != 0) {
    grasshopper_encrypt_block
              ((grasshopper_round_keys_t *)in_stack_ffffffffffffff80,
               (grasshopper_w128_t *)in_stack_ffffffffffffff78,
               (grasshopper_w128_t *)CONCAT17(uVar3,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    for (local_68 = 0; local_68 < local_60; local_68 = local_68 + 1) {
      local_40->b[local_68] = *(byte *)(lVar1 + 0x198 + local_68) ^ local_38[local_68];
    }
    EVP_CIPHER_CTX_set_num(in_RDI,local_68 & 0xffffffff);
    ctr128_inc((uchar *)0x1278fc);
  }
  return (int)in_RCX;
}

Assistant:

static int gost_grasshopper_cipher_do_ctr(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx_ctr *c = (gost_grasshopper_cipher_ctx_ctr *)
        EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    const unsigned char *current_in = in;
    unsigned char *current_out = out;
    grasshopper_w128_t *currentInputBlock;
    grasshopper_w128_t *currentOutputBlock;
    unsigned int n = EVP_CIPHER_CTX_num(ctx);
    size_t lasted = inl;
    size_t i;
    size_t blocks;
    grasshopper_w128_t *iv_buffer;
    grasshopper_w128_t tmp;

    while (n && lasted) {
        *(current_out++) = *(current_in++) ^ c->partial_buffer.b[n];
        --lasted;
        n = (n + 1) % GRASSHOPPER_BLOCK_SIZE;
    }
    EVP_CIPHER_CTX_set_num(ctx, n);
    blocks = lasted / GRASSHOPPER_BLOCK_SIZE;

    iv_buffer = (grasshopper_w128_t *) iv;

    // full parts
    for (i = 0; i < blocks; i++) {
        currentInputBlock = (grasshopper_w128_t *) current_in;
        currentOutputBlock = (grasshopper_w128_t *) current_out;
        grasshopper_encrypt_block(&c->c.encrypt_round_keys, iv_buffer,
                                  &c->partial_buffer, &c->c.buffer);
        grasshopper_plus128(&tmp, &c->partial_buffer, currentInputBlock);
        grasshopper_copy128(currentOutputBlock, &tmp);
        ctr128_inc(iv_buffer->b);
        current_in += GRASSHOPPER_BLOCK_SIZE;
        current_out += GRASSHOPPER_BLOCK_SIZE;
        lasted -= GRASSHOPPER_BLOCK_SIZE;
    }

    if (lasted > 0) {
        currentInputBlock = (grasshopper_w128_t *) current_in;
        currentOutputBlock = (grasshopper_w128_t *) current_out;
        grasshopper_encrypt_block(&c->c.encrypt_round_keys, iv_buffer,
                                  &c->partial_buffer, &c->c.buffer);
        for (i = 0; i < lasted; i++) {
            currentOutputBlock->b[i] =
                c->partial_buffer.b[i] ^ currentInputBlock->b[i];
        }
        EVP_CIPHER_CTX_set_num(ctx, i);
        ctr128_inc(iv_buffer->b);
    }

    return inl;
}